

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetFileImmutableClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,FileDescriptor *file)

{
  pointer pcVar1;
  bool bVar2;
  mapped_type *classname;
  ClassNameResolver *this_00;
  FileDescriptor *local_40;
  undefined1 local_38 [32];
  
  this_00 = (ClassNameResolver *)&local_40;
  local_40 = file;
  classname = std::
              map<const_google::protobuf::FileDescriptor_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->file_immutable_outer_class_names_,(key_type *)this_00);
  if (classname->_M_string_length == 0) {
    if ((*(byte *)(*(long *)(local_40 + 0xa0) + 0x48) & 2) == 0) {
      GetFileDefaultImmutableClassName_abi_cxx11_((string *)local_38,this_00,local_40);
      std::__cxx11::string::operator=((string *)classname,(string *)local_38);
      if ((ClassNameResolver *)local_38._0_8_ != (ClassNameResolver *)(local_38 + 0x10)) {
        operator_delete((void *)local_38._0_8_,(ulong)(local_38._16_8_ + 1));
      }
      bVar2 = HasConflictingClassName((ClassNameResolver *)local_38._0_8_,local_40,classname);
      if (bVar2) {
        std::__cxx11::string::append((char *)classname);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)classname);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (classname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + classname->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string ClassNameResolver::GetFileImmutableClassName(
    const FileDescriptor* file) {
  string& class_name = file_immutable_outer_class_names_[file];
  if (class_name.empty()) {
    if (file->options().has_java_outer_classname()) {
      class_name = file->options().java_outer_classname();
    } else {
      class_name = GetFileDefaultImmutableClassName(file);
      if (HasConflictingClassName(file, class_name)) {
        class_name += kOuterClassNameSuffix;
      }
    }
  }
  return class_name;
}